

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materialized_relation.cpp
# Opt level: O1

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::MaterializedRelation::GetTableRef(MaterializedRelation *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ColumnDefinition *pCVar3;
  pointer pCVar4;
  string *__x;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pointer *__ptr;
  long *in_RSI;
  ColumnDefinition *col;
  ColumnDefinition *this_00;
  templated_unique_single_t table_ref;
  _Head_base<0UL,_duckdb::ColumnDataRef_*,_false> local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58._M_head_impl = (ColumnDataRef *)operator_new(0x90);
  peVar1 = (element_type *)in_RSI[0x14];
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI[0x15];
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  ((local_58._M_head_impl)->super_TableRef).type = COLUMN_DATA;
  ((local_58._M_head_impl)->super_TableRef).alias._M_dataplus._M_p =
       (pointer)&((local_58._M_head_impl)->super_TableRef).alias.field_2;
  ((local_58._M_head_impl)->super_TableRef).alias._M_string_length = 0;
  ((local_58._M_head_impl)->super_TableRef).alias.field_2._M_local_buf[0] = '\0';
  ((local_58._M_head_impl)->super_TableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  ((local_58._M_head_impl)->super_TableRef).query_location.index = 0xffffffffffffffff;
  ((local_58._M_head_impl)->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ((local_58._M_head_impl)->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_58._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&((local_58._M_head_impl)->super_TableRef).column_name_alias.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&((local_58._M_head_impl)->super_TableRef).column_name_alias.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  ((local_58._M_head_impl)->super_TableRef)._vptr_TableRef =
       (_func_int **)&PTR__ColumnDataRef_02493550;
  ((local_58._M_head_impl)->expected_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_58._M_head_impl)->expected_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_58._M_head_impl)->expected_names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_58._M_head_impl)->collection).internal.
  super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  ((local_58._M_head_impl)->collection).internal.
  super___shared_ptr<duckdb::ColumnDataCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  pCVar3 = (ColumnDefinition *)in_RSI[0xe];
  for (this_00 = (ColumnDefinition *)in_RSI[0xd]; this_00 != pCVar3; this_00 = this_00 + 1) {
    pCVar4 = unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>::
             operator->((unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>
                         *)&local_58);
    __x = ColumnDefinition::Name_abi_cxx11_(this_00);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&pCVar4->expected_names,__x);
  }
  (**(code **)(*in_RSI + 0x28))(local_50);
  pCVar4 = unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>::
           operator->((unique_ptr<duckdb::ColumnDataRef,_std::default_delete<duckdb::ColumnDataRef>,_true>
                       *)&local_58);
  ::std::__cxx11::string::operator=((string *)&(pCVar4->super_TableRef).alias,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)local_58._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> MaterializedRelation::GetTableRef() {
	auto table_ref = make_uniq<ColumnDataRef>(collection);
	for (auto &col : columns) {
		table_ref->expected_names.push_back(col.Name());
	}
	table_ref->alias = GetAlias();
	return std::move(table_ref);
}